

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O2

void __thiscall
COLLADAFW::ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>::allocMemory
          (ArrayPrimitiveType<COLLADAFW::JointPrimitive_*> *this,size_t capacity,int flags)

{
  JointPrimitive **ppJVar1;
  
  if (capacity == 0) {
    ppJVar1 = (JointPrimitive **)0x0;
  }
  else {
    ppJVar1 = (JointPrimitive **)malloc(capacity * 8);
  }
  this->mData = ppJVar1;
  this->mCount = 0;
  this->mCapacity = capacity;
  this->mFlags = this->mFlags | flags;
  return;
}

Assistant:

void allocMemory ( size_t capacity, int flags = DEFAULT_ALLOC_FLAGS )
		{
			if ( capacity == 0 )
				setData ( 0, 0, 0 );
			else
				setData ( ( Type* ) ( malloc ( capacity * sizeof (Type) ) ), 0, capacity );
			mFlags |= flags;
		}